

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall
fmt::internal::FormatterBase::get_arg(FormatterBase *this,uint arg_index,char **error)

{
  bool bVar1;
  char **in_RCX;
  undefined4 in_EDX;
  FormatterBase *in_RSI;
  Arg *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = check_no_auto_index(in_RSI,in_RCX);
  if (bVar1) {
    do_get_arg((FormatterBase *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),
               (uint)((ulong)in_RCX >> 0x20),(char **)in_RSI);
  }
  else {
    memset(in_RDI,0,0x20);
  }
  return in_RDI;
}

Assistant:

Arg get_arg(unsigned arg_index, const char *&error) {
    return check_no_auto_index(error) ? do_get_arg(arg_index, error) : Arg();
  }